

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_load_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,MemOp mop,int mem_idx)

{
  TCGContext_conflict1 *tcg_ctx_00;
  ISSInfo issinfo_00;
  TCGv_i32 a32;
  TCGv_i32 val;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  ISSInfo issinfo;
  TCGContext_conflict1 *tcg_ctx;
  int mem_idx_local;
  MemOp mop_local;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  issinfo_00 = make_issinfo(s,a->rt,a->p != 0,a->w != 0);
  a32 = op_addr_ri_pre(s,a);
  val = tcg_temp_new_i32(tcg_ctx_00);
  gen_aa32_ld_i32(s,val,a32,mem_idx,mop | s->be_data);
  disas_set_da_iss(s,mop,issinfo_00);
  op_addr_ri_post(s,a,a32,0);
  store_reg_from_load(s,a->rt,val);
  return true;
}

Assistant:

static bool op_load_ri(DisasContext *s, arg_ldst_ri *a,
                       MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);

    /*
     * Perform base writeback before the loaded value to
     * ensure correct behavior with overlapping index registers.
     */
    op_addr_ri_post(s, a, addr, 0);
    store_reg_from_load(s, a->rt, tmp);
    return true;
}